

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O0

void __thiscall
mjs::gc_vector<const_mjs::function_definition_*>::erase
          (gc_vector<const_mjs::function_definition_*> *this,function_definition **elem)

{
  function_definition **ppfVar1;
  bool bVar2;
  function_definition **elem_local;
  gc_vector<const_mjs::function_definition_*> *this_local;
  
  ppfVar1 = begin(this);
  bVar2 = false;
  if (ppfVar1 <= elem) {
    ppfVar1 = end(this);
    bVar2 = elem < ppfVar1;
  }
  if (!bVar2) {
    __assert_fail("elem >= begin() && elem < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                  ,0x3a,
                  "void mjs::gc_vector<const mjs::function_definition *>::erase(T *) [T = const mjs::function_definition *]"
                 );
  }
  ppfVar1 = begin(this);
  erase(this,(uint32_t)((long)elem - (long)ppfVar1 >> 3));
  return;
}

Assistant:

void erase(T* elem) {
        assert(elem >= begin() && elem < end());
        erase(static_cast<uint32_t>(elem - begin()));
    }